

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O3

void __thiscall
chrono::ChFrame<double>::TransformParentToLocal
          (ChFrame<double> *this,ChFrame<double> *parent,ChFrame<double> *local)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  double dVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ChVector<double> CStack_58;
  ChQuaternion<double> local_40;
  
  ChTransform<double>::TransformParentToLocal
            (&(parent->coord).pos,&(this->coord).pos,&this->Amatrix);
  auVar2 = *(undefined1 (*) [32])(parent->coord).rot.m_data;
  auVar3 = vpermpd_avx2(*(undefined1 (*) [32])((parent->coord).rot.m_data + 2),0x15);
  auVar6 = vpermpd_avx2(auVar2,1);
  dVar8 = -(this->coord).rot.m_data[3];
  auVar7._0_8_ = -(this->coord).rot.m_data[1];
  auVar7._8_8_ = -(this->coord).rot.m_data[2];
  auVar7._16_8_ = -(this->coord).rot.m_data[3];
  auVar7._24_8_ =
       -(this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar12._8_8_ = dVar8;
  auVar12._0_8_ = dVar8;
  auVar12._16_8_ = dVar8;
  auVar12._24_8_ = dVar8;
  auVar4 = vpermpd_avx2(auVar7,0xd0);
  auVar7 = vpermpd_avx2(auVar7,0x11);
  auVar10 = ZEXT832((ulong)(this->coord).rot.m_data[1]);
  auVar4 = vblendpd_avx(auVar4,auVar10,1);
  auVar4 = vblendpd_avx(auVar4,auVar12,8);
  dVar1 = (parent->coord).rot.m_data[1];
  auVar11._24_8_ = dVar1;
  auVar11._16_8_ = dVar1;
  auVar9._0_8_ = auVar6._0_8_ * auVar4._0_8_;
  auVar9._8_8_ = auVar6._8_8_ * auVar4._8_8_;
  auVar9._16_8_ = auVar6._16_8_ * auVar4._16_8_;
  auVar9._24_8_ = auVar6._24_8_ * auVar4._24_8_;
  dVar1 = (this->coord).rot.m_data[0];
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4._16_8_ = dVar1;
  auVar4._24_8_ = dVar1;
  auVar6 = vfmadd231pd_avx512vl(auVar9,auVar2,auVar4);
  auVar2 = *(undefined1 (*) [32])((this->coord).rot.m_data + 2);
  dVar1 = (parent->coord).rot.m_data[2];
  auVar11._8_8_ = dVar1;
  auVar11._0_8_ = dVar1;
  auVar4 = vperm2f128_avx(auVar2,ZEXT1632(CONCAT88(0x8000000000000000,dVar8)),0x20);
  auVar4 = vpermpd_avx2(auVar4,0x24);
  auVar5 = vfmadd213pd_fma(auVar11,auVar4,auVar6);
  auVar2 = vperm2f128_avx(auVar2,auVar10,0x20);
  auVar2 = vshufpd_avx(auVar2,auVar7,9);
  auVar5 = vfmadd213pd_fma(auVar2,auVar3,ZEXT1632(auVar5));
  local_40.m_data = (double  [4])ZEXT1632(auVar5);
  SetCoord(local,&CStack_58,&local_40);
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrame<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrame<Real>& local          ///< transformed frame, in local coordinates, will be stored here
        ) const {
        local.SetCoord(TransformParentToLocal(parent.coord.pos), coord.rot.GetConjugate() % parent.coord.rot);
    }